

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManIsNormalized(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 1;
  do {
    if (p->vCis->nSize <= iVar3 + -1) {
      iVar3 = p->vCos->nSize;
      iVar1 = p->nObjs;
      iVar4 = 0;
      while( true ) {
        if (p->vCos->nSize <= iVar4) {
          return 1;
        }
        pGVar2 = Gia_ManObj(p,(iVar1 - iVar3) + iVar4);
        if (-1 < (int)(uint)*(undefined8 *)pGVar2) break;
        iVar4 = iVar4 + 1;
        if (((uint)*(undefined8 *)pGVar2 & 0x1fffffff) == 0x1fffffff) {
          return 0;
        }
      }
      return 0;
    }
    pGVar2 = Gia_ManObj(p,iVar3);
    iVar3 = iVar3 + 1;
  } while ((~*(uint *)pGVar2 & 0x9fffffff) == 0);
  return 0;
}

Assistant:

int Gia_ManIsNormalized( Gia_Man_t * p )  
{
    int i, nOffset;
    nOffset = 1;
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        if ( !Gia_ObjIsCi( Gia_ManObj(p, nOffset+i) ) )
            return 0;
    nOffset = 1 + Gia_ManCiNum(p) + Gia_ManAndNum(p);
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
        if ( !Gia_ObjIsCo( Gia_ManObj(p, nOffset+i) ) )
            return 0;
    return 1;
}